

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibNetworkException.hh
# Opt level: O0

void __thiscall mognetwork::LibNetworkException::~LibNetworkException(LibNetworkException *this)

{
  void *in_RDI;
  LibNetworkException *unaff_retaddr;
  
  ~LibNetworkException(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~LibNetworkException() throw() {}